

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O0

bool tinyusdz::GeomSubset::ValidateSubsets
               (vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                *subsets,size_t elementCount,FamilyType *familyType,string *err)

{
  ElementType EVar1;
  size_t sVar2;
  bool bVar3;
  const_reference ppGVar4;
  ElementType *pEVar5;
  string *in;
  reference ppGVar6;
  reference piVar7;
  FamilyType *pFVar8;
  reference piVar9;
  reference piVar10;
  ElementType v;
  ElementType v_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar11;
  string local_5e0 [39];
  allocator local_5b9;
  string local_5b8;
  string local_598;
  allocator local_571;
  string local_570 [32];
  string local_550;
  _Rb_tree_const_iterator<int> local_530;
  int local_524;
  undefined1 local_520 [4];
  int minIndex;
  FamilyType *local_518;
  size_t maxIndex;
  allocator local_501;
  string local_500 [32];
  string local_4e0;
  allocator local_4b9;
  string local_4b8 [32];
  string local_498;
  _Base_ptr local_478;
  undefined1 local_470;
  _Base_ptr local_468;
  undefined1 local_460;
  undefined1 local_454 [4];
  iterator iStack_450;
  int32_t index;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  string local_430;
  string local_410;
  undefined1 local_3f0 [8];
  vector<int,_std::allocator<int>_> subsetIndices;
  string local_3d0;
  string local_3b0;
  allocator local_389;
  string local_388 [32];
  fmt local_368 [39];
  allocator local_341;
  string local_340 [32];
  fmt local_320 [32];
  undefined1 local_300 [8];
  Animatable<std::vector<int,_std::allocator<int>_>_> indices;
  GeomSubset *psubset_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_> *__range1_1;
  stringstream ss;
  ostream aoStack_290 [383];
  byte local_111;
  undefined1 local_110 [7];
  bool valid;
  set<int,_std::less<int>,_std::allocator<int>_> indicesInFamily;
  string local_c0;
  allocator local_99;
  string local_98 [32];
  string local_78;
  GeomSubset *local_58;
  GeomSubset *psubset;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_> *__range1;
  ElementType elementType;
  string *err_local;
  FamilyType *familyType_local;
  size_t elementCount_local;
  vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_> *subsets_local
  ;
  
  familyType_local = (FamilyType *)elementCount;
  elementCount_local = (size_t)subsets;
  bVar3 = ::std::vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
          ::empty(subsets);
  if (bVar3) {
    subsets_local._7_1_ = 1;
  }
  else {
    ppGVar4 = ::std::
              vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>::
              operator[]((vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                          *)elementCount_local,0);
    pEVar5 = TypedAttributeWithFallback<tinyusdz::GeomSubset::ElementType>::get_value
                       (&(*ppGVar4)->elementType);
    sVar2 = elementCount_local;
    EVar1 = *pEVar5;
    __end1 = ::std::
             vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>::
             begin((vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                    *)elementCount_local);
    psubset = (GeomSubset *)
              ::std::
              vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>::
              end((vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                   *)sVar2);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_tinyusdz::GeomSubset_*const_*,_std::vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>_>
                                       *)&psubset), bVar3) {
      ppGVar6 = __gnu_cxx::
                __normal_iterator<const_tinyusdz::GeomSubset_*const_*,_std::vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>_>
                ::operator*(&__end1);
      local_58 = *ppGVar6;
      pEVar5 = TypedAttributeWithFallback<tinyusdz::GeomSubset::ElementType>::get_value
                         (&local_58->elementType);
      if (*pEVar5 != EVar1) {
        if (err != (string *)0x0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_98,"GeomSubset {}\'s elementType must be `{}`, but got `{}`.\n",&local_99
                    );
          in = &local_58->name;
          tinyusdz::to_string_abi_cxx11_(&local_c0,(tinyusdz *)(ulong)EVar1,v);
          pEVar5 = TypedAttributeWithFallback<tinyusdz::GeomSubset::ElementType>::get_value
                             (&local_58->elementType);
          tinyusdz::to_string_abi_cxx11_
                    ((string *)&indicesInFamily._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (tinyusdz *)(ulong)*pEVar5,v_00);
          fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    (&local_78,(fmt *)local_98,in,&local_c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &indicesInFamily._M_t._M_impl.super__Rb_tree_header._M_node_count,in_R9);
          ::std::__cxx11::string::operator=((string *)err,(string *)&local_78);
          ::std::__cxx11::string::~string((string *)&local_78);
          ::std::__cxx11::string::~string
                    ((string *)&indicesInFamily._M_t._M_impl.super__Rb_tree_header._M_node_count);
          ::std::__cxx11::string::~string((string *)&local_c0);
          ::std::__cxx11::string::~string(local_98);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_99);
        }
        subsets_local._7_1_ = 0;
        goto LAB_0073616b;
      }
      __gnu_cxx::
      __normal_iterator<const_tinyusdz::GeomSubset_*const_*,_std::vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>_>
      ::operator++(&__end1);
    }
    ::std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)local_110);
    local_111 = 1;
    ::std::__cxx11::stringstream::stringstream((stringstream *)&__range1_1);
    sVar2 = elementCount_local;
    __end1_1 = ::std::
               vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>::
               begin((vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                      *)elementCount_local);
    psubset_1 = (GeomSubset *)
                ::std::
                vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                ::end((vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                       *)sVar2);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<const_tinyusdz::GeomSubset_*const_*,_std::vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>_>
                               *)&psubset_1), bVar3) {
      ppGVar6 = __gnu_cxx::
                __normal_iterator<const_tinyusdz::GeomSubset_*const_*,_std::vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>_>
                ::operator*(&__end1_1);
      indices._ts._24_8_ = *ppGVar6;
      Animatable<std::vector<int,_std::allocator<int>_>_>::Animatable
                ((Animatable<std::vector<int,_std::allocator<int>_>_> *)local_300);
      bVar3 = TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>::
              get_value((TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                         *)(indices._ts._24_8_ + 0xe98),
                        (Animatable<std::vector<int,_std::allocator<int>_>_> *)local_300);
      if (!bVar3) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_340,
                   "GeomSubset {}\'s indices is not value Attribute. Connection or ValueBlock?\n",
                   &local_341);
        fmt::format<std::__cxx11::string>
                  (local_320,(string *)local_340,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (indices._ts._24_8_ + 0x9d8));
        ::std::operator<<(aoStack_290,(string *)local_320);
        ::std::__cxx11::string::~string((string *)local_320);
        ::std::__cxx11::string::~string(local_340);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_341);
        local_111 = 0;
      }
      bVar3 = Animatable<std::vector<int,_std::allocator<int>_>_>::is_blocked
                        ((Animatable<std::vector<int,_std::allocator<int>_>_> *)local_300);
      if (bVar3) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_388,"GeomSubset {}\'s indices is Value Blocked.\n",&local_389);
        fmt::format<std::__cxx11::string>
                  (local_368,(string *)local_388,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (indices._ts._24_8_ + 0x9d8));
        ::std::operator<<(aoStack_290,(string *)local_368);
        ::std::__cxx11::string::~string((string *)local_368);
        ::std::__cxx11::string::~string(local_388);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_389);
        local_111 = 0;
      }
      bVar3 = Animatable<std::vector<int,_std::allocator<int>_>_>::is_timesamples
                        ((Animatable<std::vector<int,_std::allocator<int>_>_> *)local_300);
      if ((bVar3) ||
         (bVar3 = Animatable<std::vector<int,_std::allocator<int>_>_>::has_value
                            ((Animatable<std::vector<int,_std::allocator<int>_>_> *)local_300),
         !bVar3)) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_3d0,
                   "ValidateSubsets: TimeSampled GeomSubset.indices is not yet supported.\n",
                   (allocator *)
                   ((long)&subsetIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        fmt::format(&local_3b0,&local_3d0);
        ::std::operator<<(aoStack_290,(string *)&local_3b0);
        ::std::__cxx11::string::~string((string *)&local_3b0);
        ::std::__cxx11::string::~string((string *)&local_3d0);
        ::std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&subsetIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        local_111 = 0;
      }
      ::std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_3f0);
      bVar3 = Animatable<std::vector<int,_std::allocator<int>_>_>::get_scalar
                        ((Animatable<std::vector<int,_std::allocator<int>_>_> *)local_300,
                         (vector<int,_std::allocator<int>_> *)local_3f0);
      if (!bVar3) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_430,
                   "ValidateSubsets: Internal error. Failed to get GeomSubset.indices.\n",
                   (allocator *)((long)&__range2 + 7));
        fmt::format(&local_410,&local_430);
        ::std::operator<<(aoStack_290,(string *)&local_410);
        ::std::__cxx11::string::~string((string *)&local_410);
        ::std::__cxx11::string::~string((string *)&local_430);
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
        local_111 = 0;
      }
      __end2 = ::std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)local_3f0);
      iStack_450 = ::std::vector<int,_std::allocator<int>_>::end
                             ((vector<int,_std::allocator<int>_> *)local_3f0);
      while (bVar3 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffbb0), bVar3) {
        piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end2);
        local_454 = (undefined1  [4])*piVar7;
        pVar11 = ::std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)local_110,
                            (value_type_conflict7 *)local_454);
        local_478 = (_Base_ptr)pVar11.first._M_node;
        local_470 = pVar11.second;
        bVar3 = false;
        if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          bVar3 = *familyType != Unrestricted;
        }
        local_468 = local_478;
        local_460 = local_470;
        if (bVar3) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_4b8,"Found overlapping index {} in GeomSubset `{}`\n",&local_4b9);
          fmt::format<int,std::__cxx11::string>
                    (&local_498,(fmt *)local_4b8,(string *)local_454,
                     (int *)(indices._ts._24_8_ + 0x9d8),in_R8);
          ::std::operator<<(aoStack_290,(string *)&local_498);
          ::std::__cxx11::string::~string((string *)&local_498);
          ::std::__cxx11::string::~string(local_4b8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
          local_111 = 0;
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end2);
      }
      ::std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_3f0);
      Animatable<std::vector<int,_std::allocator<int>_>_>::~Animatable
                ((Animatable<std::vector<int,_std::allocator<int>_>_> *)local_300);
      __gnu_cxx::
      __normal_iterator<const_tinyusdz::GeomSubset_*const_*,_std::vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>_>
      ::operator++(&__end1_1);
    }
    if ((*familyType == Partition) &&
       (pFVar8 = (FamilyType *)
                 ::std::set<int,_std::less<int>,_std::allocator<int>_>::size
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)local_110),
       pFVar8 != familyType_local)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_500,
                 "ValidateSubsets: The number of unique indices {} must be equal to input elementCount {}\n"
                 ,&local_501);
      maxIndex = ::std::set<int,_std::less<int>,_std::allocator<int>_>::size
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)local_110);
      fmt::format<unsigned_long,unsigned_long>
                (&local_4e0,(fmt *)local_500,(string *)&maxIndex,(unsigned_long *)&familyType_local,
                 (unsigned_long *)in_R8);
      ::std::operator<<(aoStack_290,(string *)&local_4e0);
      ::std::__cxx11::string::~string((string *)&local_4e0);
      ::std::__cxx11::string::~string(local_500);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_501);
      local_111 = 0;
    }
    ::std::set<int,_std::less<int>,_std::allocator<int>_>::rbegin
              ((set<int,_std::less<int>,_std::allocator<int>_> *)local_520);
    piVar9 = ::std::reverse_iterator<std::_Rb_tree_const_iterator<int>_>::operator*
                       ((reverse_iterator<std::_Rb_tree_const_iterator<int>_> *)local_520);
    local_518 = (FamilyType *)(long)*piVar9;
    local_530._M_node =
         (_Base_ptr)
         ::std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)local_110);
    piVar10 = ::std::_Rb_tree_const_iterator<int>::operator*(&local_530);
    local_524 = *piVar10;
    if (familyType_local <= local_518) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_570,
                 "ValidateSubsets: All indices must be in range [0, elementSize {}), but one or more indices are greater than elementSize. Maximum = {}\n"
                 ,&local_571);
      fmt::format<unsigned_long,unsigned_long>
                (&local_550,(fmt *)local_570,(string *)&familyType_local,(unsigned_long *)&local_518
                 ,(unsigned_long *)in_R8);
      ::std::operator<<(aoStack_290,(string *)&local_550);
      ::std::__cxx11::string::~string((string *)&local_550);
      ::std::__cxx11::string::~string(local_570);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_571);
      local_111 = 0;
    }
    if (local_524 < 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_5b8,
                 "ValidateSubsets: Found one or more indices that are less than 0. Minumum = {}\n",
                 &local_5b9);
      fmt::format<int>(&local_598,&local_5b8,&local_524);
      ::std::operator<<(aoStack_290,(string *)&local_598);
      ::std::__cxx11::string::~string((string *)&local_598);
      ::std::__cxx11::string::~string((string *)&local_5b8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
      local_111 = 0;
    }
    if (((local_111 & 1) == 0) && (err != (string *)0x0)) {
      ::std::__cxx11::stringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,local_5e0);
      ::std::__cxx11::string::~string(local_5e0);
    }
    subsets_local._7_1_ = 1;
    ::std::__cxx11::stringstream::~stringstream((stringstream *)&__range1_1);
    ::std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)local_110);
  }
LAB_0073616b:
  return (bool)(subsets_local._7_1_ & 1);
}

Assistant:

bool GeomSubset::ValidateSubsets(
    const std::vector<const GeomSubset *> &subsets,
    const size_t elementCount,
    const FamilyType &familyType, std::string *err) {

  if (subsets.empty()) {
    return true;
  }

  // All subsets must have the same elementType.
  GeomSubset::ElementType elementType = subsets[0]->elementType.get_value();
  for (const auto psubset : subsets) {
    if (psubset->elementType.get_value() != elementType) {
      if (err) {
        (*err) = fmt::format("GeomSubset {}'s elementType must be `{}`, but got `{}`.\n",
          psubset->name, to_string(elementType), to_string(psubset->elementType.get_value()));
      }

      return false;
    }
  }

  std::set<int32_t> indicesInFamily;

  bool valid = true;
  std::stringstream ss;

  // TODO: TimeSampled indices
  for (const auto psubset : subsets) {
    Animatable<std::vector<int32_t>> indices;
    if (!psubset->indices.get_value(&indices)) {
      ss << fmt::format("GeomSubset {}'s indices is not value Attribute. Connection or ValueBlock?\n",
          psubset->name);

      valid = false;
    }

    if (indices.is_blocked()) {
      ss << fmt::format("GeomSubset {}'s indices is Value Blocked.\n", psubset->name);
      valid = false;
    }

    if (indices.is_timesamples() || !indices.has_value()) {
      ss << fmt::format("ValidateSubsets: TimeSampled GeomSubset.indices is not yet supported.\n");
      valid = false;
    }

    std::vector<int32_t> subsetIndices;
    if (!indices.get_scalar(&subsetIndices)) {
      ss << fmt::format("ValidateSubsets: Internal error. Failed to get GeomSubset.indices.\n");
      valid = false;
    }

    for (const int32_t index : subsetIndices) {
      if (!indicesInFamily.insert(index).second && (familyType != FamilyType::Unrestricted)) {
        ss << fmt::format("Found overlapping index {} in GeomSubset `{}`\n", index, psubset->name);
        valid = false;
      }
    }
  }


  // Make sure every index appears exactly once if it's a partition.
  if ((familyType == FamilyType::Partition) && (indicesInFamily.size() != elementCount)) {
    ss << fmt::format("ValidateSubsets: The number of unique indices {} must be equal to input elementCount {}\n", indicesInFamily.size(), elementCount);
    valid = false;
  }

  // Ensure that the indices are in the range [0, faceCount)
  size_t maxIndex = static_cast<size_t>(*indicesInFamily.rbegin());
  int minIndex = *indicesInFamily.begin();

  if (maxIndex >= elementCount) {
    ss << fmt::format("ValidateSubsets: All indices must be in range [0, elementSize {}), but one or more indices are greater than elementSize. Maximum = {}\n", elementCount, maxIndex);

    valid = false;
  }

  if (minIndex < 0) {
    ss << fmt::format("ValidateSubsets: Found one or more indices that are less than 0. Minumum = {}\n", minIndex);

    valid = false;
  }

  if (!valid) {
    if (err) {
      (*err) += ss.str();
    }
  }

  return true;

}